

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string_maker<int*> * __thiscall
lest::string_maker<int*>::to_string_abi_cxx11_(string_maker<int*> *this,int *ptr)

{
  lest local_b0 [34];
  byte local_8e;
  byte local_8d;
  byte local_7a;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  int *local_18;
  int *ptr_local;
  
  local_7a = 0;
  local_8d = 0;
  local_8e = 0;
  local_18 = ptr;
  ptr_local = (int *)this;
  if (ptr != (int *)0x0) {
    make_string<int>(local_b0,ptr);
    std::__cxx11::string::string(local_38,(string *)local_b0);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string(local_78,"nullptr",&local_79);
    local_8d = 1;
    std::__cxx11::string::string(local_58,local_78);
    local_8e = 1;
    std::__cxx11::string::string(local_38,local_58);
  }
  std::__cxx11::string::string((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  if (ptr != (int *)0x0) {
    std::__cxx11::string::~string((string *)local_b0);
  }
  if ((local_8e & 1) != 0) {
    std::__cxx11::string::~string(local_58);
  }
  if ((local_8d & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return this;
}

Assistant:

static std::string to_string( T const * ptr )
    {
        return ! ptr ? lest_STRING( lest_nullptr ) : make_string( ptr );
    }